

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O0

string * gmlc::utilities::base64_encode_abi_cxx11_(void *bytes_to_encode,size_t in_len)

{
  value_type_conflict2 vVar1;
  byte bVar2;
  value_type_conflict2 vVar3;
  int iVar4;
  reference pvVar5;
  byte *pbVar6;
  reference pvVar7;
  long in_RDX;
  value_type_conflict2 *in_RSI;
  string *in_RDI;
  int jj_1;
  int jj;
  array<unsigned_char,_4UL> char_array_4;
  array<unsigned_char,_3UL> char_array_3;
  int index;
  uchar *b2e;
  string *ret;
  size_type in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  byte bVar8;
  char in_stack_ffffffffffffff8f;
  undefined4 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff94;
  undefined1 in_stack_ffffffffffffff95;
  undefined1 in_stack_ffffffffffffff96;
  byte in_stack_ffffffffffffff97;
  char cVar9;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa5;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  int local_48;
  int local_44;
  undefined1 local_3f [4];
  undefined1 local_3b [3];
  int local_38;
  undefined1 local_21;
  value_type_conflict2 *local_20;
  long local_18;
  
  local_21 = 0;
  local_20 = in_RSI;
  local_18 = in_RDX;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff97,
                      CONCAT16(in_stack_ffffffffffffff96,
                               CONCAT15(in_stack_ffffffffffffff95,
                                        CONCAT14(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90
                                                )))));
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffffa7,
                      CONCAT16(in_stack_ffffffffffffffa6,
                               CONCAT15(in_stack_ffffffffffffffa5,
                                        CONCAT14(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0
                                                )))),
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_38 = 0;
  memset(local_3b,0,3);
  memset(local_3f,0,4);
  while (local_18 != 0) {
    vVar1 = *local_20;
    local_38 = local_38 + 1;
    local_20 = local_20 + 1;
    local_18 = local_18 + -1;
    pvVar5 = std::array<unsigned_char,_3UL>::operator[]
                       ((array<unsigned_char,_3UL> *)
                        CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    *pvVar5 = vVar1;
    if (local_38 == 3) {
      pbVar6 = std::array<unsigned_char,_3UL>::operator[]
                         ((array<unsigned_char,_3UL> *)
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
      in_stack_ffffffffffffff97 = *pbVar6 >> 2;
      pbVar6 = CLI::std::array<unsigned_char,_4UL>::operator[]
                         ((array<unsigned_char,_4UL> *)
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
      *pbVar6 = in_stack_ffffffffffffff97;
      pbVar6 = std::array<unsigned_char,_3UL>::operator[]
                         ((array<unsigned_char,_3UL> *)
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
      cVar9 = (*pbVar6 & 3) << 4;
      pbVar6 = std::array<unsigned_char,_3UL>::operator[]
                         ((array<unsigned_char,_3UL> *)
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
      vVar1 = cVar9 + (*pbVar6 >> 4);
      pvVar7 = CLI::std::array<unsigned_char,_4UL>::operator[]
                         ((array<unsigned_char,_4UL> *)
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
      *pvVar7 = vVar1;
      pbVar6 = std::array<unsigned_char,_3UL>::operator[]
                         ((array<unsigned_char,_3UL> *)
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
      cVar9 = (*pbVar6 & 0xf) << 2;
      pbVar6 = std::array<unsigned_char,_3UL>::operator[]
                         ((array<unsigned_char,_3UL> *)
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
      vVar1 = cVar9 + (*pbVar6 >> 6);
      pvVar7 = CLI::std::array<unsigned_char,_4UL>::operator[]
                         ((array<unsigned_char,_4UL> *)
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
      *pvVar7 = vVar1;
      pbVar6 = std::array<unsigned_char,_3UL>::operator[]
                         ((array<unsigned_char,_3UL> *)
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
      bVar2 = *pbVar6 & 0x3f;
      pbVar6 = CLI::std::array<unsigned_char,_4UL>::operator[]
                         ((array<unsigned_char,_4UL> *)
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
      *pbVar6 = bVar2;
      for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
        pbVar6 = CLI::std::array<unsigned_char,_4UL>::operator[]
                           ((array<unsigned_char,_4UL> *)
                            CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                            in_stack_ffffffffffffff78);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                  ((basic_string_view<char,_std::char_traits<char>_> *)base64_chars,(ulong)*pbVar6);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT17(in_stack_ffffffffffffff97,
                           CONCAT16(in_stack_ffffffffffffff96,
                                    CONCAT15(in_stack_ffffffffffffff95,
                                             CONCAT14(in_stack_ffffffffffffff94,
                                                      in_stack_ffffffffffffff90)))),
                  in_stack_ffffffffffffff8f);
      }
      local_38 = 0;
    }
  }
  if (local_38 != 0) {
    local_18 = local_18 + -1;
    for (local_44 = local_38; local_44 < 3; local_44 = local_44 + 1) {
      pvVar5 = std::array<unsigned_char,_3UL>::operator[]
                         ((array<unsigned_char,_3UL> *)
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
      *pvVar5 = '\0';
    }
    pbVar6 = std::array<unsigned_char,_3UL>::operator[]
                       ((array<unsigned_char,_3UL> *)
                        CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    bVar8 = *pbVar6 >> 2;
    pbVar6 = CLI::std::array<unsigned_char,_4UL>::operator[]
                       ((array<unsigned_char,_4UL> *)CONCAT17(bVar8,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    *pbVar6 = bVar8;
    pbVar6 = std::array<unsigned_char,_3UL>::operator[]
                       ((array<unsigned_char,_3UL> *)CONCAT17(bVar8,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    bVar2 = *pbVar6;
    pbVar6 = std::array<unsigned_char,_3UL>::operator[]
                       ((array<unsigned_char,_3UL> *)CONCAT17(bVar8,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    vVar1 = (bVar2 & 3) * '\x10' + (*pbVar6 >> 4);
    pvVar7 = CLI::std::array<unsigned_char,_4UL>::operator[]
                       ((array<unsigned_char,_4UL> *)CONCAT17(bVar8,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    *pvVar7 = vVar1;
    pbVar6 = std::array<unsigned_char,_3UL>::operator[]
                       ((array<unsigned_char,_3UL> *)CONCAT17(bVar8,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    iVar4 = (*pbVar6 & 0xf) << 2;
    pbVar6 = std::array<unsigned_char,_3UL>::operator[]
                       ((array<unsigned_char,_3UL> *)CONCAT17(bVar8,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    vVar3 = (char)iVar4 + (*pbVar6 >> 6);
    pvVar7 = CLI::std::array<unsigned_char,_4UL>::operator[]
                       ((array<unsigned_char,_4UL> *)CONCAT17(bVar8,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    *pvVar7 = vVar3;
    pbVar6 = std::array<unsigned_char,_3UL>::operator[]
                       ((array<unsigned_char,_3UL> *)CONCAT17(bVar8,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    bVar2 = *pbVar6 & 0x3f;
    pbVar6 = CLI::std::array<unsigned_char,_4UL>::operator[]
                       ((array<unsigned_char,_4UL> *)CONCAT17(bVar8,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    *pbVar6 = bVar2;
    for (local_48 = 0; local_48 < local_38 + 1; local_48 = local_48 + 1) {
      pbVar6 = CLI::std::array<unsigned_char,_4UL>::operator[]
                         ((array<unsigned_char,_4UL> *)CONCAT17(bVar8,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                ((basic_string_view<char,_std::char_traits<char>_> *)base64_chars,(ulong)*pbVar6);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT17(in_stack_ffffffffffffff97,
                         CONCAT16(bVar2,CONCAT15(vVar3,CONCAT14(in_stack_ffffffffffffff94,iVar4)))),
                vVar1);
    }
    while (local_38 < 3) {
      local_38 = local_38 + 1;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT17(in_stack_ffffffffffffff97,
                         CONCAT16(bVar2,CONCAT15(vVar3,CONCAT14(in_stack_ffffffffffffff94,iVar4)))),
                vVar1);
    }
  }
  return in_RDI;
}

Assistant:

std::string base64_encode(void const* bytes_to_encode, size_t in_len)
{
    const auto* b2e = static_cast<const unsigned char*>(bytes_to_encode);
    std::string ret;
    ret.reserve((in_len * 4) / 3 + 2);
    int index{0};
    std::array<unsigned char, 3> char_array_3{{0U, 0U, 0U}};
    std::array<unsigned char, 4> char_array_4{{0U, 0U, 0U, 0U}};

    while (in_len-- != 0) {
        char_array_3[index++] = *b2e++;
        if (index == 3) {
            char_array_4[0] = (char_array_3[0] & 0xfcU) >> 2U;
            char_array_4[1] = ((char_array_3[0] & 0x03U) << 4U) +
                ((char_array_3[1] & 0xf0U) >> 4U);
            char_array_4[2] = ((char_array_3[1] & 0x0fU) << 2U) +
                ((char_array_3[2] & 0xc0U) >> 6U);
            char_array_4[3] = char_array_3[2] & 0x3fU;

            for (index = 0; (index < 4); index++) {
                ret.push_back(base64_chars[char_array_4[index]]);
            }
            index = 0;
        }
    }

    if (index != 0) {
        for (int jj = index; jj < 3; ++jj) {
            char_array_3[jj] = '\0';
        }

        char_array_4[0] = (char_array_3[0] & 0xfcU) >> 2U;
        char_array_4[1] = ((char_array_3[0] & 0x03U) << 4U) +
            ((char_array_3[1] & 0xf0U) >> 4U);
        char_array_4[2] = ((char_array_3[1] & 0x0fU) << 2U) +
            ((char_array_3[2] & 0xc0U) >> 6U);
        char_array_4[3] = char_array_3[2] & 0x3fU;

        for (int jj = 0; (jj < index + 1); ++jj) {
            ret.push_back(base64_chars[char_array_4[jj]]);
        }

        while ((index++ < 3)) {
            ret.push_back('=');
        }
    }

    return ret;
}